

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::AddSymbol
          (DescriptorIndex *this,StringPiece symbol)

{
  bool bVar1;
  size_type sVar2;
  LogMessage *pLVar3;
  iterator iter_00;
  size_type extraout_RDX;
  anon_unknown_31 *this_00;
  DescriptorIndex *in_R9;
  StringPiece name;
  StringPiece symbol_name;
  StringPiece symbol_name_00;
  StringPiece local_128;
  SymbolCompare local_118;
  SymbolEntry *local_110;
  const_iterator flat_iter;
  StringPiece local_100;
  const_iterator local_f0;
  const_iterator iter;
  LogMessage local_e0;
  anon_unknown_31 *local_a8;
  char *pcStack_a0;
  undefined1 local_88 [8];
  string entry_as_string;
  undefined1 local_50 [8];
  SymbolEntry entry;
  DescriptorIndex *this_local;
  StringPiece symbol_local;
  
  this_00 = (anon_unknown_31 *)symbol.ptr_;
  entry.encoded_symbol.field_2._8_8_ = this;
  sVar2 = std::
          vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
          ::size(&this->all_values_);
  local_50._0_4_ = (int)sVar2 + -1;
  entry_as_string.field_2._8_8_ = this_00;
  EncodeString_abi_cxx11_((String *)&entry,this,symbol);
  SymbolEntry::AsString_abi_cxx11_((string *)local_88,(SymbolEntry *)local_50,this);
  name.length_ = extraout_RDX;
  name.ptr_ = (char *)symbol.length_;
  local_a8 = this_00;
  pcStack_a0 = (char *)symbol.length_;
  bVar1 = anon_unknown_31::ValidateSymbolName(this_00,name);
  if (bVar1) {
    local_f0 = (anonymous_namespace)::
               FindLastLessOrEqual<std::set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
                         (&this->by_symbol_,(SymbolEntry *)local_50);
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
              (&local_100,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    flat_iter._M_current =
         (SymbolEntry *)
         std::
         set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
         ::end(&this->by_symbol_);
    symbol_name.length_ = (size_type)&local_f0;
    symbol_name.ptr_ = (char *)local_100.length_;
    bVar1 = CheckForMutualSubsymbols<std::_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,std::_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>
                      ((protobuf *)local_100.ptr_,symbol_name,
                       (_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
                        *)flat_iter._M_current,
                       (_Rb_tree_const_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>
                        )this,in_R9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_118.index =
           (DescriptorIndex *)
           std::
           set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
           ::key_comp(&this->by_symbol_);
      local_110 = (SymbolEntry *)
                  (anonymous_namespace)::
                  FindLastLessOrEqual<std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                            (&this->by_symbol_flat_,(SymbolEntry *)local_50,&local_118);
      stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
                (&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      iter_00 = std::
                vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                ::end(&this->by_symbol_flat_);
      symbol_name_00.length_ = (size_type)&local_110;
      symbol_name_00.ptr_ = (char *)local_128.length_;
      bVar1 = CheckForMutualSubsymbols<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex>
                        ((protobuf *)local_128.ptr_,symbol_name_00,
                         (__normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
                          *)iter_00._M_current,
                         (__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
                          )this,in_R9);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::
        set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
        ::insert(&this->by_symbol_,local_f0,(value_type *)local_50);
        symbol_local.length_._7_1_ = true;
      }
      else {
        symbol_local.length_._7_1_ = false;
      }
    }
    else {
      symbol_local.length_._7_1_ = false;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_e0,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2bf);
    pLVar3 = internal::LogMessage::operator<<(&local_e0,"Invalid symbol name: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)local_88);
    internal::LogFinisher::operator=((LogFinisher *)((long)&iter._M_node + 7),pLVar3);
    internal::LogMessage::~LogMessage(&local_e0);
    symbol_local.length_._7_1_ = false;
  }
  iter._M_node._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_88);
  SymbolEntry::~SymbolEntry((SymbolEntry *)local_50);
  return symbol_local.length_._7_1_;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddSymbol(
    StringPiece symbol) {
  SymbolEntry entry = {static_cast<int>(all_values_.size() - 1),
                       EncodeString(symbol)};
  std::string entry_as_string = entry.AsString(*this);

  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(symbol)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << entry_as_string;
    return false;
  }

  auto iter = FindLastLessOrEqual(&by_symbol_, entry);
  if (!CheckForMutualSubsymbols(entry_as_string, &iter, by_symbol_.end(),
                                *this)) {
    return false;
  }

  // Same, but on by_symbol_flat_
  auto flat_iter =
      FindLastLessOrEqual(&by_symbol_flat_, entry, by_symbol_.key_comp());
  if (!CheckForMutualSubsymbols(entry_as_string, &flat_iter,
                                by_symbol_flat_.end(), *this)) {
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, entry);

  return true;
}